

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

size_t rtosc_scan_arg_val(char *src,rtosc_arg_val_t *arg,size_t nargs,char *buffer_for_strings,
                         size_t *bufsize,size_t args_before,int follow_ellipsis)

{
  size_t sVar1;
  char cVar2;
  uint8_t uVar3;
  byte bVar4;
  int32_t iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  __int32_t **pp_Var9;
  uint8_t *puVar10;
  ushort **ppuVar11;
  size_t sVar12;
  rtosc_arg_val_t *prVar13;
  _func_int_int *property;
  rtosc_arg_val_t *prVar14;
  size_t i_1;
  uint8_t *puVar15;
  uint8_t *puVar16;
  int32_t i;
  uint uVar17;
  long lVar18;
  bool bVar19;
  uint8_t *local_108;
  char local_fd;
  int rd;
  uint8_t *local_f8;
  char *local_f0;
  int rd_1;
  rtosc_arg_val_t *local_d0;
  size_t local_c8;
  int32_t local_bc;
  float secfracsf;
  rtosc_arg_t rStack_b0;
  int32_t tmp;
  undefined1 auStack_94 [4];
  rtosc_arg_t local_90 [3];
  ushort **local_60;
  size_t local_58;
  size_t zero;
  rtosc_arg_val_t tmp_2;
  
  rd = 0;
  bVar4 = *src;
  uVar8 = (ulong)(bVar4 - 0x4d);
  puVar10 = (uint8_t *)src;
  local_108 = (uint8_t *)src;
  local_c8 = args_before;
  if (bVar4 - 0x4d < 0x28) {
    if ((0x8212000000U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 == 0) {
        iVar6 = strncmp("MIDI",src,4);
        if (iVar6 == 0) {
          ppuVar11 = __ctype_b_loc();
          if (((long)src[4] == 0x5b) || (((*ppuVar11)[src[4]] & 0x2000) != 0)) {
            arg->type = 'm';
            __isoc99_sscanf(src,"MIDI [ 0x%x 0x%x 0x%x 0x%x ]%n",&tmp,auStack_94,local_90,
                            local_90[0].m + 4,&rd);
            for (lVar18 = 0; puVar10 = (uint8_t *)(src + rd), lVar18 != 4; lVar18 = lVar18 + 1) {
              (arg->val).m[lVar18] = auStack_94[lVar18 * 4 + -4];
            }
            goto LAB_0010d1a6;
          }
        }
LAB_0010d199:
        puVar10 = (uint8_t *)parse_identifier((char *)puVar10,arg,buffer_for_strings,bufsize);
      }
      else {
        if (uVar8 != 0xe) goto LAB_0010ce26;
        local_f8 = (uint8_t *)(nargs - 1);
        local_60 = __ctype_b_loc();
        do {
          uVar8 = (ulong)(char)puVar10[1];
          puVar10 = puVar10 + 1;
        } while ((*(byte *)((long)*local_60 + uVar8 * 2 + 1) & 0x20) != 0);
        prVar13 = arg + 1;
        sVar12 = 0;
        local_fd = ' ';
        iVar6 = 0;
        puVar16 = local_f8;
        local_108 = puVar10;
        local_f0 = src;
        local_d0 = arg;
        while ((arg = local_d0, (char)uVar8 != ']' && ((uVar8 & 0xff) != 0))) {
          sVar1 = *bufsize;
          local_f8 = (uint8_t *)buffer_for_strings;
          local_bc = iVar6;
          local_58 = sVar12;
          sVar12 = rtosc_scan_arg_val((char *)puVar10,prVar13,(size_t)puVar16,buffer_for_strings,
                                      bufsize,sVar12,1);
          cVar2 = prVar13->type;
          if (cVar2 == '-') {
            iVar5 = rtosc_av_rep_has_delta(prVar13);
            prVar14 = prVar13 + 2;
            if (iVar5 == 0) {
              prVar14 = prVar13 + 1;
            }
            cVar2 = prVar14->type;
          }
          local_fd = cVar2;
          iVar6 = next_arg_offset(prVar13);
          prVar13 = prVar13 + iVar6;
          puVar10 = puVar10 + (sVar12 - 1);
          do {
            uVar8 = (ulong)(char)puVar10[1];
            puVar10 = puVar10 + 1;
          } while ((*(byte *)((long)*local_60 + uVar8 * 2 + 1) & 0x20) != 0);
          puVar16 = puVar16 + -(long)iVar6;
          iVar6 = iVar6 + local_bc;
          buffer_for_strings = (char *)(local_f8 + (sVar1 - *bufsize));
          sVar12 = local_58 + 1;
        }
        local_108 = puVar10 + 1;
        local_d0->type = 'a';
        rtosc_av_arr_type_set(local_d0,local_fd);
        rtosc_av_arr_len_set(arg,iVar6);
        src = local_f0;
        puVar10 = local_108;
      }
    }
    else {
      pcVar7 = skip_word("immediately",(char **)&local_108);
      if ((pcVar7 == (char *)0x0) &&
         (pcVar7 = skip_word("now",(char **)&local_108), pcVar7 == (char *)0x0)) {
        pcVar7 = skip_word("true",(char **)&local_108);
        if ((pcVar7 == (char *)0x0) &&
           (pcVar7 = skip_word("false",(char **)&local_108), pcVar7 == (char *)0x0)) {
          pcVar7 = skip_word("nil",(char **)&local_108);
          if ((pcVar7 == (char *)0x0) &&
             (pcVar7 = skip_word("inf",(char **)&local_108), puVar10 = local_108,
             pcVar7 == (char *)0x0)) goto LAB_0010d199;
          pp_Var9 = __ctype_toupper_loc();
          arg->type = (char)(*pp_Var9)[bVar4];
          puVar10 = local_108;
        }
        else {
          pp_Var9 = __ctype_toupper_loc();
          arg->type = (char)(*pp_Var9)[bVar4];
          (arg->val).T = local_108[-2] == 'u';
          puVar10 = local_108;
        }
      }
      else {
        rtosc_arg_val_immediatelly(arg);
        puVar10 = local_108;
      }
    }
  }
  else {
LAB_0010ce26:
    if (bVar4 == 0x22) {
      local_108 = (uint8_t *)(src + 1);
      local_f8 = (uint8_t *)buffer_for_strings;
      while( true ) {
        while (*local_108 != '\"') {
          *bufsize = *bufsize - 1;
          uVar3 = *local_108;
          local_108 = local_108 + 1;
          if (uVar3 == '\\') {
            uVar3 = get_escaped_char(*local_108,0);
            *buffer_for_strings = uVar3;
            local_108 = local_108 + 1;
          }
          else {
            *buffer_for_strings = uVar3;
          }
          buffer_for_strings = (char *)((uint8_t *)buffer_for_strings + 1);
        }
        if (local_108[1] != '\\') break;
        skip_fmt((char **)&local_108,"\"\\ \"%n");
      }
      *buffer_for_strings = '\0';
      *bufsize = *bufsize - 1;
      (arg->val).s = (char *)local_f8;
      cVar2 = 's';
      puVar10 = local_108 + 1;
      if (local_108[1] == 'S') {
        *bufsize = *bufsize - 1;
        cVar2 = 'S';
        puVar10 = local_108 + 2;
      }
      local_108 = puVar10;
      arg->type = cVar2;
      puVar10 = local_108;
    }
    else if (bVar4 == 0x23) {
      arg->type = 'r';
      __isoc99_sscanf(src + 1,"%x",&arg->val);
      puVar10 = (uint8_t *)(src + 9);
    }
    else if (bVar4 == 0x27) {
      arg->type = 'c';
      pcVar7 = src + 1;
      uVar17 = (uint)src[1];
      if (uVar17 == 0x5c) {
        cVar2 = src[3];
        uVar17 = 0x5c;
        if (((long)cVar2 != 0) &&
           (ppuVar11 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar11 + (long)cVar2 * 2 + 1) & 0x20) == 0)) {
          pcVar7 = src + 2;
          bVar4 = get_escaped_char(src[2],1);
          uVar17 = (uint)bVar4;
        }
      }
      (arg->val).i = uVar17;
      puVar10 = (uint8_t *)(pcVar7 + 2);
    }
    else if (bVar4 == 0x42) {
      arg->type = 'b';
      local_f8 = (uint8_t *)buffer_for_strings;
      __isoc99_sscanf(src,"BLOB [ %i %n",&arg->val,&rd);
      buffer_for_strings = (char *)local_f8;
      if ((long)rd == 0) goto LAB_0010d199;
      pcVar7 = src + rd;
      *bufsize = *bufsize - (long)(arg->val).i;
      (arg->val).b.data = local_f8;
      local_f0 = src;
      for (lVar18 = 0; lVar18 < (arg->val).i; lVar18 = lVar18 + 1) {
        __isoc99_sscanf(pcVar7,"0x%x %n",&tmp,&rd_1);
        (arg->val).b.data[lVar18] = (uint8_t)tmp;
        pcVar7 = pcVar7 + rd_1;
      }
      src = local_f0;
      puVar10 = (uint8_t *)(pcVar7 + 1);
    }
    else {
      local_f8 = (uint8_t *)buffer_for_strings;
      iVar6 = is_range_multiplier(src);
      if (iVar6 == 0) {
        if ((bVar4 == 0x5f) ||
           (ppuVar11 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar11 + (long)(char)bVar4 * 2 + 1) & 4) != 0)) {
          arg->type = 'S';
          (arg->val).s = (char *)local_f8;
          puVar16 = local_f8;
          while ((uVar3 = *puVar10, (long)(char)uVar3 == 0x5f ||
                 (ppuVar11 = __ctype_b_loc(), ((*ppuVar11)[(char)uVar3] & 8) != 0))) {
            *bufsize = *bufsize - 1;
            *puVar16 = *puVar10;
            puVar16 = puVar16 + 1;
            puVar10 = puVar10 + 1;
          }
          *bufsize = *bufsize - 1;
          *puVar16 = '\0';
        }
        else if ((((bVar4 == 0) || (src[1] == '\0')) || (src[2] == '\0')) ||
                ((src[3] == '\0' || (src[4] != '-')))) {
          bVar19 = false;
          arg->type = '\0';
          _secfracsf = _secfracsf & 0xffffffffffffff00;
          local_f0 = src;
          do {
            rd = 0;
            property = (_func_int_int *)scanf_fmtstr((char *)puVar10,(char *)&secfracsf);
            fast_strcpy((char *)&tmp,(char *)property,0x10);
            tmp._0_2_ = CONCAT11(0x25,(uint8_t)tmp);
            if (arg->type == '\0') {
              arg->type = secfracsf._0_1_;
            }
            if ((secfracsf._0_1_ - 100 < 6) && ((0x35U >> (secfracsf._0_1_ - 100 & 0x1f) & 1) != 0))
            {
              property = (_func_int_int *)((long)&tmp + 1);
              __isoc99_sscanf(puVar10,property,&arg->val,&rd);
            }
            puVar10 = puVar10 + rd;
            if (bVar19) {
              local_108 = puVar10;
              skip_fmt((char **)&local_108," )%n");
              src = local_f0;
              puVar10 = local_108;
              break;
            }
            _rd_1 = puVar10;
            skip_while((char **)&rd_1,property);
            if (*_rd_1 == '(') {
              _rd_1 = _rd_1 + 1;
              skip_while((char **)&rd_1,property);
              bVar19 = true;
              puVar10 = _rd_1;
            }
            src = local_f0;
          } while (bVar19);
        }
        else {
          (arg->val).d = 0.0;
          local_90[0].i = 0;
          tmp = 0;
          auStack_94 = (undefined1  [4])0x0;
          local_d0 = arg;
          __isoc99_sscanf(src,"%4d-%2d-%2d%n",local_90[0].m + 0xc,local_90[0].m + 8,
                          local_90[0].m + 4);
          puVar10 = (uint8_t *)(src + rd);
          rd = 0;
          local_108 = puVar10;
          __isoc99_sscanf(puVar10," %2d:%2d%n",local_90,auStack_94,&rd);
          if ((long)rd != 0) {
            puVar10 = puVar10 + rd;
            local_108 = puVar10;
          }
          rd = 0;
          __isoc99_sscanf(puVar10,":%2d%n",&tmp,&rd);
          if ((long)rd != 0) {
            local_108 = puVar10 + rd;
          }
          iVar6 = skip_fmt((char **)&local_108,"%*f (%n");
          puVar10 = local_108;
          if (iVar6 == 0) {
            if (*local_108 == '.') {
              __isoc99_sscanf(local_108,"%f%n",&secfracsf,&rd);
              local_108 = puVar10 + rd;
              _rd_1 = (uint8_t *)rtosc_float2secfracs(secfracsf);
            }
            else {
              _rd_1 = (uint8_t *)0x0;
            }
          }
          else {
            __isoc99_sscanf(local_108," ... + 0x%8lxp-32 s )%n",&rd_1,&rd);
            local_108 = puVar10 + rd;
          }
          arg = local_d0;
          local_90[0]._8_8_ =
               CONCAT44((int)((ulong)local_90[0]._8_8_ >> 0x20) + -0x76c,
                        (int)local_90[0].b.data + -1);
          rtosc_arg_val_from_params(local_d0,(tm_conflict *)&tmp,(uint64_t)_rd_1);
          puVar10 = local_108;
        }
      }
      else {
        _rd_1 = (uint8_t *)((ulong)_rd_1 & 0xffffffff00000000);
        __isoc99_sscanf(src,"%dx%n",&tmp,&rd_1);
        lVar18 = (long)rd_1;
        arg->type = '-';
        rtosc_av_rep_num_set(arg,tmp);
        rtosc_av_rep_has_delta_set(arg,0);
        sVar12 = rtosc_scan_arg_val(src + lVar18,arg + 1,nargs - 1,(char *)local_f8,bufsize,0,0);
        iVar6 = next_arg_offset(arg + 1);
        arg = arg + (long)iVar6 + 1;
        puVar10 = (uint8_t *)(src + lVar18 + sVar12);
      }
    }
  }
LAB_0010d1a6:
  local_108 = puVar10;
  puVar10 = local_108;
  ppuVar11 = __ctype_b_loc();
  puVar16 = puVar10 + 1;
  do {
    puVar15 = puVar16;
    puVar16 = puVar15 + 1;
  } while ((*(byte *)((long)*ppuVar11 + (long)(char)puVar15[-1] * 2 + 1) & 0x20) != 0);
  local_108 = puVar10;
  if ((((follow_ellipsis == 0) || (puVar15[-1] != '.')) || (*puVar15 != '.')) || (*puVar16 != '.'))
  goto LAB_0010d355;
  rStack_b0.b.data = (arg->val).b.data;
  secfracsf._0_1_ = arg->type;
  unique0x100005b0 = *(undefined7 *)&arg->field_0x1;
  rStack_b0.d = (arg->val).d;
  do {
    uVar3 = puVar16[1];
    puVar16 = puVar16 + 1;
  } while ((*(byte *)((long)*ppuVar11 + (long)(char)uVar3 * 2 + 1) & 0x20) != 0);
  local_108 = puVar16;
  if (uVar3 != ']') {
    sVar12 = rtosc_scan_arg_val((char *)puVar16,(rtosc_arg_val_t *)&rd_1,1,(char *)0x0,&zero,0,0);
    local_108 = puVar16 + sVar12;
  }
  if ((local_c8 < 3) || (arg[-3].type != '-')) {
LAB_0010d2a6:
    prVar13 = arg + -1;
  }
  else {
    prVar13 = arg + -3;
    iVar5 = rtosc_av_rep_has_delta(prVar13);
    if (iVar5 == 0) goto LAB_0010d2a6;
    iVar5 = rtosc_av_rep_num(prVar13);
    prVar13 = rtosc_arg_val_range_arg(prVar13,iVar5 + -1,&tmp_2);
  }
  bVar19 = true;
  if ((secfracsf._0_1_ != '-' && local_c8 != 0) &&
     (iVar6 = types_match(prVar13->type,secfracsf._0_1_), iVar6 != 0)) {
    iVar6 = rtosc_arg_vals_cmp_single
                      (prVar13,(rtosc_arg_val_t *)&secfracsf,(rtosc_cmp_options *)0x0);
    bVar19 = iVar6 == 0;
  }
  if (uVar3 == ']') {
    uVar17 = 0;
    iVar5 = 0;
    if (bVar19 == false) goto LAB_0010d2f6;
  }
  else {
LAB_0010d2f6:
    prVar14 = (rtosc_arg_val_t *)&rd_1;
    if (uVar3 == ']') {
      prVar14 = (rtosc_arg_val_t *)0x0;
    }
    iVar5 = delta_from_arg_vals(prVar13,(rtosc_arg_val_t *)&secfracsf,prVar14,
                                (rtosc_arg_val_t *)&tmp,(uint)bVar19);
    uVar17 = (uint)(iVar5 != -1 || uVar3 != ']');
  }
  insert_arg_range(arg,iVar5,(rtosc_arg_val_t *)&secfracsf,uVar17,(rtosc_arg_val_t *)&tmp,1,1);
LAB_0010d355:
  return (long)local_108 - (long)src;
}

Assistant:

size_t rtosc_scan_arg_val(const char* src,
                          rtosc_arg_val_t *arg, size_t nargs,
                          char* buffer_for_strings, size_t* bufsize,
                          size_t args_before, int follow_ellipsis)
{
    int rd = 0;
    const char* start = src;
    assert(nargs);
    --nargs;
    switch(*src)
    {
        case 't':
        case 'f':
        case 'n':
        case 'i':
        {
            const char* src_backup = src;
            // timestamps "immediately" or "now"?
            if(skip_word("immediately", &src) || skip_word("now", &src))
            {
                rtosc_arg_val_immediatelly(arg);
            }
            else if(skip_word("true", &src)  ||
                    skip_word("false", &src) )
            {
                arg->type = toupper(*src_backup);
                arg->val.T = (src[-2] == 'u');
            }
            else if(skip_word("nil", &src)   ||
                    skip_word("inf", &src))
            {
                arg->type = toupper(*src_backup);
            }
            else
            {
                // no reserved keyword => identifier
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            }
            break;
        }
        case '#':
        {
            arg->type = 'r';
            sscanf(++src, "%x", &arg->val.i);
            src+=8;
            break;
        }
        case '\'':
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\'<isspace> => mistyped backslash
            arg->type = 'c';
            if(*++src == '\\')
            {
                if(src[2] && !isspace(src[2])) // escaped and 4 chars
                    arg->val.i = get_escaped_char(*++src, true);
                else // escaped, but only 3 chars: type 4
                    arg->val.i = '\\';
            }
            else // non-escaped
                arg->val.i = *src;
            src+=2;
            break;
        case '"':
        {
            ++src; // skip obligatory '"'
            char* dest = buffer_for_strings;
            bool cont;
            do
            {
                while(*src != '"')
                {
                    (*bufsize)--;
                    assert(*bufsize);
                    if(*src == '\\') {
                        *dest++ = get_escaped_char(*++src, false);
                        ++src;
                    }
                    else
                        *dest++ = *src++;
                }
                if(src[1] == '\\')
                {
                    skip_fmt(&src, "\"\\ \"%n");
                    cont = true;
                }
                else
                    cont = false;
            } while (cont);
            *dest = 0;
            ++src; // skip final '"'
            (*bufsize)--;
            arg->val.s = buffer_for_strings;
            if(*src == 'S')
            {
                ++src;
                (*bufsize)--;
                arg->type = 'S';
            }
            else
                arg->type = 's';
            break;
        }
        case 'M':
        {
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                arg->type = 'm';
                int32_t tmp[4];
                sscanf(src, "MIDI [ 0x%"PRIx32" 0x%"PRIx32
                                  " 0x%"PRIx32" 0x%"PRIx32" ]%n",
                       tmp, tmp + 1, tmp + 2, tmp + 3, &rd); src+=rd;
                for(size_t i = 0; i < 4; ++i)
                    arg->val.m[i] = tmp[i]; // copy to 8 bit array
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        case '[':
        {
            while(isspace(*++src));
            int32_t num_read = 0;

            rtosc_arg_val_t* start_arg = arg++;

            size_t last_bufsize;

            char arrtype = ' ';
            for(size_t i = 0; src && *src && *src != ']'; ++i)
            {
                last_bufsize = *bufsize;

                src += rtosc_scan_arg_val(src, arg, nargs,
                                          buffer_for_strings, bufsize, i, 1);
                arrtype = arg->type;
                if(arrtype == '-')
                    arrtype = rtosc_av_rep_has_delta(arg) ? arg[2].type : arg[1].type;

                size_t args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                num_read += args_scanned;

                for( ; isspace(*src); ++src) ;

                buffer_for_strings += (last_bufsize - *bufsize);
                // TODO: allow comments in arrays, blobs, midi?
            }

            ++src; // ']'
            start_arg->type = 'a';
            rtosc_av_arr_type_set(start_arg, arrtype);
            rtosc_av_arr_len_set(start_arg, num_read);

            arg = start_arg; // invariant: arg is back at the start
            break;
        }
        case 'B': // blob
        {
            arg->type = 'b';
            sscanf(src, "BLOB [ %"PRIi32" %n", &arg->val.b.len, &rd);
            if(rd)
            {
                src +=rd;

                assert(*bufsize >= (size_t)arg->val.b.len);
                *bufsize -= (size_t)arg->val.b.len;
                arg->val.b.data = (uint8_t*)buffer_for_strings;
                for(int32_t i = 0; i < arg->val.b.len; ++i)
                {
                    int32_t tmp;
                    int rd;
                    sscanf(src, "0x%x %n", &tmp, &rd);
                    arg->val.b.data[i] = tmp;
                    src+=rd;
                }

                ++src; // skip ']'
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        default:
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                // collect information for range_arg
                int multiplier, rd = 0;
                sscanf(src, "%dx%n", &multiplier, &rd);
                src += rd;
                arg->type = '-';
                rtosc_av_rep_num_set(arg, multiplier);
                rtosc_av_rep_has_delta_set(arg, 0);

                ++arg;
                // read value-arg
                size_t old_bufsize = *bufsize;
                size_t tmp = rtosc_scan_arg_val(src, arg, nargs,
                                                buffer_for_strings, bufsize,
                                                0, 0);
                buffer_for_strings += old_bufsize - *bufsize;
                int args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                src += tmp;
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                arg->type = 'S';
                arg->val.s = buffer_for_strings;
                for(; *src == '_' || isalnum(*src); ++src)
                {
                    assert(*bufsize);
                    (*bufsize)--;
                    *buffer_for_strings = *src;
                    ++buffer_for_strings;
                }
                assert(*bufsize);
                (*bufsize)--;
                *buffer_for_strings = 0;
                ++buffer_for_strings;
            }
            // "YYYY-" => it's a date
            else if(src[0] && src[1] && src[2] && src[3] && src[4] == '-')
            {
                arg->val.t = 0;

                struct tm m_tm;
                m_tm.tm_hour = 0;
                m_tm.tm_min = 0;
                m_tm.tm_sec = 0;
                sscanf(src, "%4d-%2d-%2d%n",
                       &m_tm.tm_year, &m_tm.tm_mon, &m_tm.tm_mday, &rd);
                src+=rd;
                float secfracsf;

                rd = 0;
                sscanf(src, " %2d:%2d%n", &m_tm.tm_hour, &m_tm.tm_min, &rd);
                if(rd)
                 src+=rd;

                rd = 0;
                sscanf(src, ":%2d%n", &m_tm.tm_sec, &rd);
                if(rd)
                 src+=rd;

                uint64_t secfracs;

                // lossless format is appended in parentheses?
                //  => take it directly from there
                if(skip_fmt(&src, "%*f (%n"))
                {
                    sscanf(src, " ... + 0x%8"PRIx64"p-32 s )%n",
                           &secfracs, &rd);
                    src += rd;
                }
                // float number, but not lossless?
                //  => convert it to fractions of seconds
                else if(*src == '.')
                {
                    sscanf(src, "%f%n", &secfracsf, &rd);
                    src += rd;

                    secfracs = rtosc_float2secfracs(secfracsf);
                }
                else
                {
                    // no fractional / floating seconds part
                    secfracs = 0;
                }

                // posix adjustments
                m_tm.tm_year -= 1900;
                --m_tm.tm_mon;
                rtosc_arg_val_from_params(arg, &m_tm, secfracs);
            }
            else
            {
                char bytes16[16];
                char type = arg->type = 0;

                bool repeat_once = false;
                do
                {
                    rd = 0;

                    const char *fmtstr = scanf_fmtstr_scan(src, bytes16,
                                                           &type);
                    if(!arg->type) // the first occurrence determines the type
                     arg->type = type;

                    switch(type)
                    {
                        case 'h':
                            sscanf(src, fmtstr, &arg->val.h, &rd); break;
                        case 'i':
                            sscanf(src, fmtstr, &arg->val.i, &rd); break;
                        case 'f':
                            sscanf(src, fmtstr, &arg->val.f, &rd); break;
                        case 'd':
                            sscanf(src, fmtstr, &arg->val.d, &rd); break;
                    }
                    src += rd;

                    if(repeat_once)
                    {
                        // we have read the lossless part. skip spaces and ')'
                        skip_fmt(&src, " )%n");
                        repeat_once = false;
                    }
                    else
                    {
                        // is a lossless part appended in parentheses?
                        const char* after_num = src;
                        skip_while(&after_num, isspace);
                        if(*after_num == '(') {
                            ++after_num;
                            skip_while(&after_num, isspace);
                            src = after_num;
                            repeat_once = true;
                        }
                    }
                } while(repeat_once);
            } // date vs integer
        // case ident
    } // switch

    // is the argument being followed by an ellipsis?
    const char* src2 = src;
    for(; isspace(*src2); ++src2) ;

    if(follow_ellipsis && !strncmp(src2, "...", 3))
    {
        src = src2;
        rtosc_arg_val_t delta, rhs;
        size_t zero;

        // lhsarg has already been read
        rtosc_arg_val_t lhsarg = *arg;

        // skip ellipsis and read rhs
        src += 2;
        while(isspace(*++src)) ;

        int infinite_range = (*src == ']');

        if(!infinite_range)
            src += rtosc_scan_arg_val(src, &rhs, 1, NULL, &zero, 0, 0);

        /*
            these shall be conforming to delta_from_arg_vals,
            i.e. if ranges,    the last elements of the ranges
                 if no ranges, the elements themselves
         */
        // find llhs position
        rtosc_arg_val_t tmp;
        // argument "-2" could be a delta arg
        rtosc_arg_val_t* llhsarg = (args_before > 2 &&
                                    arg[-3].type == '-' &&
                                    rtosc_av_rep_has_delta(arg-3))
                      // -2 is a delta arg (following a range arg)?
                      ? rtosc_arg_val_range_arg(arg-3, rtosc_av_rep_num(arg-3)-1,
                                                &tmp)
                      : (args_before > 1 && arg[-2].type == '-')
                      // -2 is a range arg (without delta)?
                      ? arg-1
                      : arg-1; // normal case

        bool llhsarg_is_useless =
            (args_before < 1 ||
            lhsarg.type == '-' || !types_match(llhsarg->type, lhsarg.type)
            /* this includes llhsarg == '-' */
            || !rtosc_arg_vals_cmp_single(llhsarg, &lhsarg, NULL));


        bool has_delta = true;
        int32_t num;
        if(infinite_range && llhsarg_is_useless)
        {
            has_delta = false;
            num = 0; // suppress compiler warnings
        }
        else
        {
            num = delta_from_arg_vals(llhsarg, &lhsarg,
                                      infinite_range ? NULL : &rhs,
                                      &delta, llhsarg_is_useless);

            assert(infinite_range || num > 0);
            if(infinite_range && num == -1)
            {
                has_delta = false;
            }
        }

        insert_arg_range(arg, num, &lhsarg, has_delta, &delta, true, true);
    }

    return (size_t)(src-start);
}